

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

bool asl::Directory::create(String *name)

{
  bool bVar1;
  bool bVar2;
  String parent;
  Path path;
  Directory local_80;
  String local_60;
  String local_48;
  String local_30;
  
  if (name->_len < 1) {
    bVar2 = false;
  }
  else {
    bVar1 = createOne(name);
    bVar2 = true;
    if (!bVar1) {
      Path::Path((Path *)&local_80,name);
      Path::absolute((Path *)&local_48,(Path *)&local_80);
      String::~String(&local_80._path);
      Path::directory((Path *)&local_80,(Path *)&local_48);
      String::String(&local_60,&local_80._path);
      String::~String(&local_80._path);
      Directory(&local_80,&local_60);
      directory(&local_30,&local_80);
      String::~String(&local_30);
      ~Directory(&local_80);
      if ((0 < local_30._len) && (0 < local_60._len)) {
        Directory(&local_80,&local_60);
        bVar2 = exists(&local_80);
        ~Directory(&local_80);
        if (!bVar2) {
          create(&local_60);
        }
      }
      bVar2 = createOne(name);
      String::~String(&local_60);
      String::~String(&local_48);
    }
  }
  return bVar2;
}

Assistant:

bool Directory::move(const String& from, const String& to)
{
	String dst = to;
	File tofile(to);
	if(tofile.isDirectory())
		dst = to + '/' + File(from).name();

	if(rename(from, dst) == 0)
		return true;
	if(errno == EXDEV) // different file systems: copy and del
	{
		copy(from, dst);
		remove(from);
	}
	return false;
}